

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

double anon_unknown.dwarf_66e92::roundtrip<double>(double *in)

{
  double out;
  double *in_stack_00000218;
  double *in_stack_00000220;
  undefined8 local_10;
  
  (anonymous_namespace)::roundtrip_into<double,double>(in_stack_00000220,in_stack_00000218);
  return local_10;
}

Assistant:

T roundtrip(const T& in)
{
  T out;
  roundtrip_into(in, out);
  return out;
}